

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionSettings.cpp
# Opt level: O3

istream * FIX::operator>>(istream *stream,SessionSettings *s)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  string sessionQualifier;
  TargetCompID targetCompID;
  SenderCompID senderCompID;
  Dictionary dict;
  SessionID sessionID;
  BeginString beginString;
  Settings settings;
  Dictionary def;
  vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_> local_458;
  string local_438;
  SessionSettings *local_418;
  pointer local_410;
  string local_408;
  undefined1 local_3e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  undefined1 local_3c8 [16];
  _Alloc_hider local_3b8;
  size_type local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  field_metrics local_398;
  undefined1 local_390 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  undefined1 local_370 [16];
  _Alloc_hider local_360;
  size_type local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  field_metrics local_340;
  istream *local_338;
  undefined **local_330;
  undefined **local_328;
  pointer local_320;
  undefined1 local_318 [8];
  pointer pDStack_310;
  pointer local_308;
  _Base_ptr local_300;
  _Base_ptr local_2f8;
  _Base_ptr local_2f0;
  size_t local_2e8;
  _Alloc_hider local_2e0;
  size_type local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  undefined1 local_2b8 [88];
  FieldBase local_260;
  FieldBase local_208;
  _Alloc_hider local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  undefined1 local_168 [8];
  pointer pDStack_160;
  undefined1 local_158 [32];
  _Alloc_hider local_138;
  size_type local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  field_metrics local_118;
  Settings local_108;
  undefined1 local_e8 [8];
  undefined1 auStack_e0 [8];
  _Rb_tree_node_base local_d8;
  size_t local_b8;
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  undefined1 local_88 [56];
  _Alloc_hider local_50;
  char local_40 [16];
  
  local_108.m_resolveEnvVars = s->m_resolveEnvVars;
  local_108.m_sections.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.m_sections.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.m_sections.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_418 = s;
  operator>>(stream,&local_108);
  local_458.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_458.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_458.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b8._0_8_ = local_2b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"DEFAULT","");
  Settings::get((Sections *)local_318,&local_108,(string *)local_2b8);
  local_d8._0_8_ =
       local_458.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  auStack_e0 = (undefined1  [8])
               local_458.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  local_e8 = (undefined1  [8])
             local_458.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl
             .super__Vector_impl_data._M_start;
  local_458.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_308;
  local_458.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_318;
  local_458.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
  super__Vector_impl_data._M_finish = pDStack_310;
  local_318 = (undefined1  [8])0x0;
  pDStack_310 = (pointer)0x0;
  local_308 = (pointer)0x0;
  std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::~vector
            ((vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_> *)local_e8);
  std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::~vector
            ((vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_> *)local_318);
  if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  local_d8._M_left = &local_d8;
  local_410 = (pointer)&PTR__Dictionary_001f5658;
  local_e8 = (undefined1  [8])&PTR__Dictionary_001f5658;
  local_d8._0_8_ = local_d8._0_8_ & 0xffffffff00000000;
  local_d8._M_parent = (_Base_ptr)0x0;
  local_b8 = 0;
  local_b0._M_p = (pointer)&local_a0;
  local_a8 = 0;
  local_a0._M_local_buf[0] = '\0';
  local_d8._M_right = local_d8._M_left;
  if (local_458.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_458.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)auStack_e0,
                &((local_458.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>.
                   _M_impl.super__Vector_impl_data._M_start)->m_data)._M_t);
    std::__cxx11::string::_M_assign((string *)&local_b0);
  }
  SessionSettings::set(local_418,(Dictionary *)local_e8);
  local_2b8._0_8_ = local_2b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"SESSION","");
  Settings::get((Sections *)local_168,&local_108,(string *)local_2b8);
  local_308 = local_458.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  pDStack_310 = local_458.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  local_318 = (undefined1  [8])
              local_458.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_458.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_158._0_8_;
  local_458.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_168;
  local_458.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
  super__Vector_impl_data._M_finish = pDStack_160;
  local_168 = (undefined1  [8])0x0;
  pDStack_160 = (pointer)0x0;
  local_158._0_8_ = (pointer)0x0;
  local_338 = stream;
  std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::~vector
            ((vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_> *)local_318);
  std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::~vector
            ((vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_> *)local_168);
  if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  local_2f8 = (_Base_ptr)&local_308;
  local_318 = (undefined1  [8])local_410;
  local_308 = (pointer)((ulong)local_308 & 0xffffffff00000000);
  local_300 = (_Base_ptr)0x0;
  local_2e8 = 0;
  local_2e0._M_p = (pointer)&local_2d0;
  local_2d8 = 0;
  local_2d0._M_local_buf[0] = '\0';
  local_2f0 = local_2f8;
  if (local_458.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_458.super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_320 = (pointer)&PTR__FieldBase_001f5568;
    local_328 = &PTR__FieldBase_001f55e8;
    local_330 = &PTR__FieldBase_001f5620;
    lVar3 = 0x38;
    uVar2 = 0;
    do {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&pDStack_310,
                  (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)((long)local_458.
                            super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar3 + -0x30));
      std::__cxx11::string::_M_assign((string *)&local_2e0);
      Dictionary::merge((Dictionary *)local_318,(Dictionary *)local_e8);
      local_390._0_8_ = local_390 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"BeginString","");
      Dictionary::getString((string *)local_2b8,(Dictionary *)local_318,(string *)local_390,false);
      local_168 = (undefined1  [8])&PTR__FieldBase_001f55c8;
      pDStack_160 = (pointer)CONCAT44(pDStack_160._4_4_,8);
      local_158._0_8_ = local_158 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_158,local_2b8._0_8_,(pointer)(local_2b8._0_8_ + local_2b8._8_8_));
      local_138._M_p = (pointer)&local_128;
      local_130 = 0;
      local_128._M_local_buf[0] = '\0';
      local_118.m_length = 0;
      local_118.m_checksum = 0;
      local_168 = (undefined1  [8])local_320;
      if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
        operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
      }
      if ((undefined1 *)local_390._0_8_ != local_390 + 0x10) {
        operator_delete((void *)local_390._0_8_,(ulong)(local_380._M_allocated_capacity + 1));
      }
      local_3e8._0_8_ = local_3e8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"SenderCompID","");
      Dictionary::getString((string *)local_2b8,(Dictionary *)local_318,(string *)local_3e8,false);
      local_390._0_8_ = &PTR__FieldBase_001f55c8;
      local_390._8_4_ = 0x31;
      local_380._M_allocated_capacity = (size_type)local_370;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_390 + 0x10),local_2b8._0_8_,
                 (pointer)(local_2b8._0_8_ + local_2b8._8_8_));
      local_360._M_p = (pointer)&local_350;
      local_358 = 0;
      local_350._M_local_buf[0] = '\0';
      local_340.m_length = 0;
      local_340.m_checksum = 0;
      local_390._0_8_ = local_328;
      if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
        operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
      }
      if ((undefined1 *)local_3e8._0_8_ != local_3e8 + 0x10) {
        operator_delete((void *)local_3e8._0_8_,(ulong)(local_3d8._M_allocated_capacity + 1));
      }
      local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"TargetCompID","");
      Dictionary::getString((string *)local_2b8,(Dictionary *)local_318,&local_438,false);
      local_3e8._0_8_ = &PTR__FieldBase_001f55c8;
      local_3e8._8_4_ = 0x38;
      local_3d8._M_allocated_capacity = (size_type)local_3c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_3e8 + 0x10),local_2b8._0_8_,
                 (pointer)(local_2b8._0_8_ + local_2b8._8_8_));
      local_3b8._M_p = (pointer)&local_3a8;
      local_3b0 = 0;
      local_3a8._M_local_buf[0] = '\0';
      local_398.m_length = 0;
      local_398.m_checksum = 0;
      local_3e8._0_8_ = local_330;
      if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
        operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p,
                        CONCAT71(local_438.field_2._M_allocated_capacity._1_7_,
                                 local_438.field_2._M_local_buf[0]) + 1);
      }
      local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
      local_438._M_string_length = 0;
      local_438.field_2._M_local_buf[0] = '\0';
      local_2b8._0_8_ = local_2b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"SessionQualifier","");
      bVar1 = Dictionary::has((Dictionary *)local_318,(string *)local_2b8);
      if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
        operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
      }
      if (bVar1) {
        local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"SessionQualifier","");
        Dictionary::getString((string *)local_2b8,(Dictionary *)local_318,&local_408,false);
        std::__cxx11::string::operator=((string *)&local_438,(string *)local_2b8);
        if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
          operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
        }
      }
      SessionID::SessionID
                ((SessionID *)local_2b8,(string *)local_158,(string *)(local_390 + 0x10),
                 (string *)(local_3e8 + 0x10),&local_438);
      local_88._0_8_ = local_410;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_88 + 8),
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&pDStack_310);
      local_50._M_p = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_2e0._M_p,local_2e0._M_p + local_2d8);
      SessionSettings::set(local_418,(SessionID *)local_2b8,(Dictionary *)local_88);
      Dictionary::~Dictionary((Dictionary *)local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_p != &local_178) {
        operator_delete(local_188._M_p,local_178._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_p != &local_1a0) {
        operator_delete(local_1b0._M_p,local_1a0._M_allocated_capacity + 1);
      }
      FieldBase::~FieldBase(&local_208);
      FieldBase::~FieldBase(&local_260);
      FieldBase::~FieldBase((FieldBase *)local_2b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_dataplus._M_p != &local_438.field_2) {
        operator_delete(local_438._M_dataplus._M_p,
                        CONCAT71(local_438.field_2._M_allocated_capacity._1_7_,
                                 local_438.field_2._M_local_buf[0]) + 1);
      }
      FieldBase::~FieldBase((FieldBase *)local_3e8);
      FieldBase::~FieldBase((FieldBase *)local_390);
      FieldBase::~FieldBase((FieldBase *)local_168);
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x58;
    } while (uVar2 < (ulong)(((long)local_458.
                                    super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_458.
                                    super__Vector_base<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x2e8ba2e8ba2e8ba3));
  }
  Dictionary::~Dictionary((Dictionary *)local_318);
  Dictionary::~Dictionary((Dictionary *)local_e8);
  std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::~vector(&local_458);
  std::vector<FIX::Dictionary,_std::allocator<FIX::Dictionary>_>::~vector(&local_108.m_sections);
  return local_338;
}

Assistant:

EXCEPT(ConfigError) {
  Settings settings(s.m_resolveEnvVars);
  stream >> settings;

  Settings::Sections section;

  section = settings.get("DEFAULT");
  Dictionary def;
  if (section.size()) {
    def = section[0];
  }
  s.set(def);

  section = settings.get("SESSION");
  Settings::Sections::size_type session;
  Dictionary dict;

  for (session = 0; session < section.size(); ++session) {
    dict = section[session];
    dict.merge(def);

    BeginString beginString(dict.getString(BEGINSTRING));
    SenderCompID senderCompID(dict.getString(SENDERCOMPID));
    TargetCompID targetCompID(dict.getString(TARGETCOMPID));

    std::string sessionQualifier;
    if (dict.has(SESSION_QUALIFIER)) {
      sessionQualifier = dict.getString(SESSION_QUALIFIER);
    }
    SessionID sessionID(beginString, senderCompID, targetCompID, sessionQualifier);
    s.set(sessionID, dict);
  }
  return stream;
}